

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message_differencer_unittest.cc
# Opt level: O1

void __thiscall
google::protobuf::anon_unknown_0::ComparisonTest_AddDelete_FieldOrderingTest_Test::TestBody
          (ComparisonTest_AddDelete_FieldOrderingTest_Test *this)

{
  byte *pbVar1;
  char *message;
  AssertionResult gtest_ar;
  AssertHelper local_50;
  internal local_48 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_40;
  string local_38;
  
  protobuf::internal::ExtensionSet::ClearExtension
            (&(this->super_ComparisonTest).orderings_proto1_.field_0._impl_._extensions_,
             proto2_unittest::my_extension_string);
  (this->super_ComparisonTest).orderings_proto2_.field_0._impl_.my_int_ = 0;
  pbVar1 = (byte *)((long)&(this->super_ComparisonTest).orderings_proto2_.field_0 + 0x18);
  *pbVar1 = *pbVar1 & 0xfb;
  protobuf::(anonymous_namespace)::ComparisonTest::Run_abi_cxx11_
            (&local_38,this,&(this->super_ComparisonTest).orderings_proto1_.super_Message,
             &(this->super_ComparisonTest).orderings_proto2_.super_Message);
  testing::internal::CmpHelperEQ<char[72],std::__cxx11::string>
            (local_48,
             "\"deleted: my_int: 1\\n\" \"added: (proto2_unittest.my_extension_string): \\\"bar\\\"\\n\""
             ,"RunOrder()",
             (char (*) [72])
             "deleted: my_int: 1\nadded: (proto2_unittest.my_extension_string): \"bar\"\n",&local_38
            );
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_38._M_dataplus._M_p != &local_38.field_2) {
    operator_delete(local_38._M_dataplus._M_p,local_38.field_2._M_allocated_capacity + 1);
  }
  if (local_48[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_38);
    if (local_40 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      message = anon_var_dwarf_a12c75 + 5;
    }
    else {
      message = (local_40->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_50,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/util/message_differencer_unittest.cc"
               ,0xdc3,message);
    testing::internal::AssertHelper::operator=(&local_50,(Message *)&local_38);
    testing::internal::AssertHelper::~AssertHelper(&local_50);
    if ((long *)local_38._M_dataplus._M_p != (long *)0x0) {
      (**(code **)(*(long *)local_38._M_dataplus._M_p + 8))();
    }
  }
  if (local_40 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_40,local_40);
  }
  return;
}

Assistant:

TEST_F(ComparisonTest, AddDelete_FieldOrderingTest) {
  orderings_proto1_.ClearExtension(unittest::my_extension_string);
  orderings_proto2_.clear_my_int();

  EXPECT_EQ(
      "deleted: my_int: 1\n"
      "added: (proto2_unittest.my_extension_string): \"bar\"\n",
      RunOrder());
}